

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O2

U32 XXH32_finalize(U32 h32,void *ptr,size_t len,XXH_endianess endian,XXH_alignment align)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  U32 UVar4;
  BYTE *p;
  
  switch((uint)len & 0xf) {
  case 0xc:
    uVar3 = *ptr * -0x3d4d51c3 + h32;
    ptr = (void *)((long)ptr + 4);
    h32 = (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f;
  case 8:
    uVar3 = *ptr * -0x3d4d51c3 + h32;
    ptr = (void *)((long)ptr + 4);
    h32 = (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f;
  case 4:
    uVar3 = *ptr * -0x3d4d51c3 + h32;
    UVar4 = XXH32_avalanche((uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f);
    return UVar4;
  case 0xd:
    uVar3 = *ptr * -0x3d4d51c3 + h32;
    ptr = (void *)((long)ptr + 4);
    h32 = (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f;
  case 9:
    uVar3 = *ptr * -0x3d4d51c3 + h32;
    ptr = (void *)((long)ptr + 4);
    h32 = (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f;
  case 5:
    uVar3 = *ptr * -0x3d4d51c3 + h32;
    iVar2 = (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f;
    bVar1 = *(byte *)((long)ptr + 4);
    break;
  case 0xe:
    uVar3 = *ptr * -0x3d4d51c3 + h32;
    ptr = (void *)((long)ptr + 4);
    h32 = (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f;
  case 10:
    uVar3 = *ptr * -0x3d4d51c3 + h32;
    ptr = (void *)((long)ptr + 4);
    h32 = (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f;
  case 6:
    uVar3 = *ptr * -0x3d4d51c3 + h32;
    uVar3 = (uint)*(byte *)((long)ptr + 4) * 0x165667b1 +
            (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f;
    iVar2 = (uVar3 * 0x800 | uVar3 >> 0x15) * -0x61c8864f;
    bVar1 = *(byte *)((long)ptr + 5);
    break;
  case 0xf:
    uVar3 = *ptr * -0x3d4d51c3 + h32;
    ptr = (void *)((long)ptr + 4);
    h32 = (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f;
  case 0xb:
    uVar3 = *ptr * -0x3d4d51c3 + h32;
    ptr = (void *)((long)ptr + 4);
    h32 = (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f;
  case 7:
    uVar3 = *ptr * -0x3d4d51c3 + h32;
    ptr = (void *)((long)ptr + 4);
    h32 = (uVar3 * 0x20000 | uVar3 >> 0xf) * 0x27d4eb2f;
  case 3:
    uVar3 = (uint)*ptr * 0x165667b1 + h32;
    ptr = (void *)((long)ptr + 1);
    h32 = (uVar3 * 0x800 | uVar3 >> 0x15) * -0x61c8864f;
  case 2:
    uVar3 = (uint)*ptr * 0x165667b1 + h32;
    ptr = (void *)((long)ptr + 1);
    h32 = (uVar3 * 0x800 | uVar3 >> 0x15) * -0x61c8864f;
  case 1:
    uVar3 = (uint)*ptr * 0x165667b1 + h32;
    h32 = (uVar3 * 0x800 | uVar3 >> 0x15) * -0x61c8864f;
  case 0:
    UVar4 = XXH32_avalanche(h32);
    return UVar4;
  }
  uVar3 = (uint)bVar1 * 0x165667b1 + iVar2;
  UVar4 = XXH32_avalanche((uVar3 * 0x800 | uVar3 >> 0x15) * -0x61c8864f);
  return UVar4;
}

Assistant:

static U32
XXH32_finalize(U32 h32, const void* ptr, size_t len,
                XXH_endianess endian, XXH_alignment align)

{
    const BYTE* p = (const BYTE*)ptr;
#define PROCESS1             \
    h32 += (*p) * PRIME32_5; \
    p++;                     \
    h32 = XXH_rotl32(h32, 11) * PRIME32_1 ;

#define PROCESS4                         \
    h32 += XXH_get32bits(p) * PRIME32_3; \
    p+=4;                                \
    h32  = XXH_rotl32(h32, 17) * PRIME32_4 ;

    switch(len&15)  /* or switch(bEnd - p) */
    {
      case 12:      PROCESS4;
                    /* fallthrough */
      case 8:       PROCESS4;
                    /* fallthrough */
      case 4:       PROCESS4;
                    return XXH32_avalanche(h32);

      case 13:      PROCESS4;
                    /* fallthrough */
      case 9:       PROCESS4;
                    /* fallthrough */
      case 5:       PROCESS4;
                    PROCESS1;
                    return XXH32_avalanche(h32);

      case 14:      PROCESS4;
                    /* fallthrough */
      case 10:      PROCESS4;
                    /* fallthrough */
      case 6:       PROCESS4;
                    PROCESS1;
                    PROCESS1;
                    return XXH32_avalanche(h32);

      case 15:      PROCESS4;
                    /* fallthrough */
      case 11:      PROCESS4;
                    /* fallthrough */
      case 7:       PROCESS4;
                    /* fallthrough */
      case 3:       PROCESS1;
                    /* fallthrough */
      case 2:       PROCESS1;
                    /* fallthrough */
      case 1:       PROCESS1;
                    /* fallthrough */
      case 0:       return XXH32_avalanche(h32);
    }
    assert(0);
    return h32;   /* reaching this point is deemed impossible */
}